

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void perfetto::base::StringCopy(char *dst,char *src,size_t dst_size)

{
  char cVar1;
  size_t i;
  size_t sVar2;
  
  for (i = 0; (sVar2 = dst_size, dst_size != i &&
              (cVar1 = src[i], dst[i] = cVar1, sVar2 = i, cVar1 != '\0')); i = i + 1) {
  }
  if (dst_size - 1 < sVar2) {
    dst[dst_size - 1] = '\0';
  }
  return;
}

Assistant:

inline void StringCopy(char* dst, const char* src, size_t dst_size) {
  for (size_t i = 0; i < dst_size; ++i) {
    if ((dst[i] = src[i]) == '\0') {
      return;  // We hit and copied the null terminator.
    }
  }

  // We were left off at dst_size. We over copied 1 byte. Null terminate.
  if (PERFETTO_LIKELY(dst_size > 0))
    dst[dst_size - 1] = 0;
}